

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.h
# Opt level: O2

void __thiscall
DatabaseName::DatabaseName
          (DatabaseName *this,path *db_base,string *type,string *id,string *filename)

{
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_base,db_base);
  std::__cxx11::string::string((string *)&this->type,(string *)type);
  std::__cxx11::string::string((string *)&this->id,(string *)id);
  std::__cxx11::string::string((string *)&this->filename,(string *)filename);
  return;
}

Assistant:

DatabaseName(fs::path db_base, std::string type, std::string id,
                 std::string filename)
        : db_base(db_base), type(type), id(id), filename(filename) {}